

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

bool __thiscall
Assimp::FBX::FBXConverter::GenerateTransformationNodeChain
          (FBXConverter *this,Model *model,string *name,
          vector<aiNode_*,_std::allocator<aiNode_*>_> *output_nodes,
          vector<aiNode_*,_std::allocator<aiNode_*>_> *post_output_nodes)

{
  pointer *pppaVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  PropertyTable *this_00;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  RotOrder mode;
  long lVar14;
  Property *pPVar15;
  iterator iVar16;
  aiMatrix4x4t<float> *paVar17;
  aiNode *paVar18;
  int iVar19;
  _Rb_tree_color _Var20;
  string *psVar21;
  iterator iVar22;
  FBXConverter *pFVar23;
  FBXConverter *pFVar24;
  vector<aiNode*,std::allocator<aiNode*>> *this_01;
  aiMatrix4x4t<float> *this_02;
  _Rb_tree_color _Var25;
  _Rb_tree_color _Var26;
  size_t i;
  ulong uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  aiNode *nd_1;
  aiNode *nd;
  aiMatrix4x4 chain [17];
  float local_728;
  float local_6c4;
  float local_6c0;
  float local_6bc;
  undefined1 local_6a8 [8];
  float local_6a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_698;
  float local_688;
  float local_684;
  float local_680;
  float local_67c;
  float local_678;
  float local_674;
  float local_670;
  float local_66c;
  float local_668;
  float local_664;
  float local_660;
  float local_65c;
  float local_658;
  float local_654;
  float local_650;
  float local_64c;
  float local_648;
  float local_644;
  aiVector3D local_640;
  aiVector3D local_630;
  aiVector3D local_620;
  undefined1 local_610 [32];
  undefined1 local_5f0 [112];
  ios_base local_580 [204];
  float afStack_4b4 [15];
  aiMatrix4x4t<float> local_478;
  aiMatrix4x4t<float> local_438;
  undefined4 local_3f8;
  undefined8 local_3f4;
  ulong uStack_3ec;
  undefined4 local_3e4;
  ulong local_3e0;
  undefined8 uStack_3d8;
  undefined4 local_3d0;
  ulong local_3cc;
  undefined8 uStack_3c4;
  undefined4 local_3bc;
  undefined4 local_3b8;
  undefined8 local_3b4;
  ulong uStack_3ac;
  undefined4 local_3a4;
  long local_3a0;
  undefined8 uStack_398;
  undefined4 local_390;
  ulong local_38c;
  undefined8 uStack_384;
  undefined4 local_37c;
  undefined4 local_378;
  undefined8 local_374;
  ulong uStack_36c;
  undefined4 local_364;
  long local_360;
  undefined8 uStack_358;
  undefined4 local_350;
  ulong local_34c;
  undefined8 uStack_344;
  undefined4 local_33c;
  undefined4 local_338;
  undefined8 local_334;
  ulong uStack_32c;
  undefined4 local_324;
  long local_320;
  undefined8 uStack_318;
  undefined4 local_310;
  ulong local_30c;
  undefined8 uStack_304;
  undefined4 local_2fc;
  aiMatrix4x4 local_2f8;
  aiMatrix4x4 local_2b8;
  aiMatrix4x4 local_278;
  undefined4 local_238;
  undefined8 local_234;
  ulong uStack_22c;
  undefined4 local_224;
  ulong local_220;
  undefined8 uStack_218;
  undefined4 local_210;
  ulong local_20c;
  undefined8 uStack_204;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined8 local_1f4;
  ulong uStack_1ec;
  undefined4 local_1e4;
  long local_1e0;
  undefined8 uStack_1d8;
  undefined4 local_1d0;
  ulong local_1cc;
  undefined8 uStack_1c4;
  undefined4 local_1bc;
  undefined4 local_1b8;
  undefined8 local_1b4;
  ulong uStack_1ac;
  undefined4 local_1a4;
  long local_1a0;
  undefined8 uStack_198;
  undefined4 local_190;
  ulong local_18c;
  undefined8 uStack_184;
  undefined4 local_17c;
  float local_178;
  undefined8 local_174;
  undefined8 uStack_16c;
  float local_164;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150;
  undefined8 local_14c;
  undefined8 uStack_144;
  undefined4 local_13c;
  undefined4 local_138;
  undefined8 local_134;
  ulong uStack_12c;
  undefined4 local_124;
  ulong local_120;
  undefined8 uStack_118;
  undefined4 local_110;
  ulong local_10c;
  undefined8 uStack_104;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined8 local_f4;
  ulong uStack_ec;
  undefined4 local_e4;
  long local_e0;
  undefined8 uStack_d8;
  undefined4 local_d0;
  ulong local_cc;
  undefined8 uStack_c4;
  undefined4 local_bc;
  aiMatrix4x4 local_b8;
  float local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  float local_64;
  undefined8 local_60;
  undefined8 uStack_58;
  float local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 local_3c;
  
  this_00 = (model->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (PropertyTable *)0x0) {
    __assert_fail("props.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.h"
                  ,0x1b4,"const PropertyTable &Assimp::FBX::Model::Props() const");
  }
  mode = Model::RotationOrder(model);
  lVar14 = 0;
  do {
    *(undefined4 *)((long)&local_478.a1 + lVar14) = 0x3f800000;
    *(undefined8 *)((long)&local_478.a2 + lVar14) = 0;
    *(undefined8 *)((long)&local_478.a4 + lVar14) = 0;
    *(undefined4 *)((long)&local_478.b2 + lVar14) = 0x3f800000;
    *(undefined8 *)((long)&local_478.b3 + lVar14) = 0;
    *(undefined8 *)((long)&local_478.c1 + lVar14) = 0;
    *(undefined4 *)((long)&local_478.c3 + lVar14) = 0x3f800000;
    *(undefined8 *)((long)&local_478.c4 + lVar14) = 0;
    *(undefined8 *)((long)&local_478.d2 + lVar14) = 0;
    *(undefined4 *)((long)&local_478.d4 + lVar14) = 0x3f800000;
    lVar14 = lVar14 + 0x40;
  } while (lVar14 != 0x440);
  lVar14 = 0;
  do {
    *(undefined4 *)((long)&local_478.a1 + lVar14) = 0x3f800000;
    *(undefined8 *)((long)&local_478.a2 + lVar14) = 0;
    *(undefined8 *)((long)&local_478.a4 + lVar14) = 0;
    *(undefined4 *)((long)&local_478.b2 + lVar14) = 0x3f800000;
    *(undefined8 *)((long)&local_478.b3 + lVar14) = 0;
    *(undefined8 *)((long)&local_478.c1 + lVar14) = 0;
    *(undefined4 *)((long)&local_478.c3 + lVar14) = 0x3f800000;
    *(undefined8 *)((long)&local_478.c4 + lVar14) = 0;
    *(undefined8 *)((long)&local_478.d2 + lVar14) = 0;
    *(undefined4 *)((long)&local_478.d4 + lVar14) = 0x3f800000;
    lVar14 = lVar14 + 0x40;
  } while (lVar14 != 0x440);
  pFVar24 = (FBXConverter *)(local_5f0 + 0x10);
  local_5f0._0_8_ = pFVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"PreRotation","");
  pPVar15 = PropertyTable::Get(this_00,(string *)local_5f0);
  local_620.x = 0.0;
  local_620.y = 0.0;
  fVar31 = 0.0;
  if (pPVar15 == (Property *)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    lVar14 = __dynamic_cast(pPVar15,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar14 == 0) {
      fVar31 = 0.0;
      local_620.x = 0.0;
      local_620.y = 0.0;
    }
    else {
      local_620.x = (float)*(undefined8 *)(lVar14 + 8);
      local_620.y = (float)((ulong)*(undefined8 *)(lVar14 + 8) >> 0x20);
      fVar31 = *(float *)(lVar14 + 0x10);
      bVar13 = true;
    }
  }
  pFVar23 = (FBXConverter *)local_5f0._0_8_;
  local_620.z = fVar31;
  if ((FBXConverter *)local_5f0._0_8_ != pFVar24) {
    operator_delete((void *)local_5f0._0_8_);
  }
  _Var25 = _S_red;
  if ((bVar13) &&
     (_Var25 = _S_red,
     1.1920929e-07 < fVar31 * fVar31 + local_620.x * local_620.x + local_620.y * local_620.y)) {
    GetRotationMatrix(pFVar23,RotOrder_EulerXYZ,&local_620,&local_2f8);
    _Var25 = 0x40;
  }
  local_5f0._0_8_ = pFVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"PostRotation","");
  pPVar15 = PropertyTable::Get(this_00,(string *)local_5f0);
  local_630.x = 0.0;
  local_630.y = 0.0;
  fVar31 = 0.0;
  if (pPVar15 == (Property *)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    lVar14 = __dynamic_cast(pPVar15,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar14 == 0) {
      fVar31 = 0.0;
      local_630.x = 0.0;
      local_630.y = 0.0;
    }
    else {
      local_630.x = (float)*(undefined8 *)(lVar14 + 8);
      local_630.y = (float)((ulong)*(undefined8 *)(lVar14 + 8) >> 0x20);
      fVar31 = *(float *)(lVar14 + 0x10);
      bVar13 = true;
    }
  }
  pFVar23 = (FBXConverter *)local_5f0._0_8_;
  local_630.z = fVar31;
  if ((FBXConverter *)local_5f0._0_8_ != pFVar24) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar13) &&
     (1.1920929e-07 < fVar31 * fVar31 + local_630.x * local_630.x + local_630.y * local_630.y)) {
    _Var25 = _Var25 | 0x100;
    GetRotationMatrix(pFVar23,RotOrder_EulerXYZ,&local_630,&local_278);
  }
  local_5f0._0_8_ = pFVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"RotationPivot","");
  pPVar15 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar36 = 0.0;
  fVar37 = 0.0;
  fVar31 = 0.0;
  if (pPVar15 == (Property *)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    lVar14 = __dynamic_cast(pPVar15,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar14 == 0) {
      fVar31 = 0.0;
      fVar36 = 0.0;
      fVar37 = 0.0;
    }
    else {
      fVar36 = (float)*(undefined8 *)(lVar14 + 8);
      fVar37 = (float)((ulong)*(undefined8 *)(lVar14 + 8) >> 0x20);
      fVar31 = *(float *)(lVar14 + 0x10);
      bVar13 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar24) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar13) && (1.1920929e-07 < fVar31 * fVar31 + fVar36 * fVar36 + fVar37 * fVar37)) {
    _Var25 = _Var25 | 0x220;
    local_338 = 0x3f800000;
    local_334 = 0;
    local_324 = 0x3f800000;
    uStack_318 = 0;
    local_310 = 0x3f800000;
    uStack_304 = 0;
    local_2fc = 0x3f800000;
    uStack_32c = (ulong)(uint)fVar36;
    local_320 = (ulong)(uint)fVar37 << 0x20;
    local_30c = (ulong)(uint)fVar31;
    local_238 = 0x3f800000;
    local_234 = 0;
    local_224 = 0x3f800000;
    uStack_218 = 0;
    local_210 = 0x3f800000;
    uStack_204 = 0;
    local_1fc = 0x3f800000;
    uStack_22c = (ulong)(uint)fVar36 ^ 0x80000000;
    local_220 = (ulong)(uint)fVar37 << 0x20 ^ 0x8000000000000000;
    local_20c = (ulong)(uint)fVar31 ^ 0x80000000;
  }
  local_5f0._0_8_ = pFVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"RotationOffset","");
  pPVar15 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar36 = 0.0;
  fVar37 = 0.0;
  fVar31 = 0.0;
  if (pPVar15 == (Property *)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    lVar14 = __dynamic_cast(pPVar15,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar14 == 0) {
      fVar31 = 0.0;
      fVar36 = 0.0;
      fVar37 = 0.0;
    }
    else {
      fVar36 = (float)*(undefined8 *)(lVar14 + 8);
      fVar37 = (float)((ulong)*(undefined8 *)(lVar14 + 8) >> 0x20);
      fVar31 = *(float *)(lVar14 + 0x10);
      bVar13 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar24) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar13) && (1.1920929e-07 < fVar31 * fVar31 + fVar36 * fVar36 + fVar37 * fVar37)) {
    _Var25 = _Var25 | 0x10;
    local_378 = 0x3f800000;
    local_374 = 0;
    local_364 = 0x3f800000;
    uStack_358 = 0;
    local_350 = 0x3f800000;
    uStack_344 = 0;
    local_33c = 0x3f800000;
    uStack_36c = (ulong)(uint)fVar36;
    local_360 = (ulong)(uint)fVar37 << 0x20;
    local_34c = (ulong)(uint)fVar31;
  }
  local_5f0._0_8_ = pFVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"ScalingOffset","");
  pPVar15 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar36 = 0.0;
  fVar37 = 0.0;
  fVar31 = 0.0;
  if (pPVar15 == (Property *)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    lVar14 = __dynamic_cast(pPVar15,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar14 == 0) {
      fVar31 = 0.0;
      fVar36 = 0.0;
      fVar37 = 0.0;
    }
    else {
      fVar36 = (float)*(undefined8 *)(lVar14 + 8);
      fVar37 = (float)((ulong)*(undefined8 *)(lVar14 + 8) >> 0x20);
      fVar31 = *(float *)(lVar14 + 0x10);
      bVar13 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar24) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar13) && (1.1920929e-07 < fVar31 * fVar31 + fVar36 * fVar36 + fVar37 * fVar37)) {
    _Var25 = _Var25 | 0x400;
    local_1f8 = 0x3f800000;
    local_1f4 = 0;
    local_1e4 = 0x3f800000;
    uStack_1d8 = 0;
    local_1d0 = 0x3f800000;
    uStack_1c4 = 0;
    local_1bc = 0x3f800000;
    uStack_1ec = (ulong)(uint)fVar36;
    local_1e0 = (ulong)(uint)fVar37 << 0x20;
    local_1cc = (ulong)(uint)fVar31;
  }
  local_5f0._0_8_ = pFVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"ScalingPivot","");
  pPVar15 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar36 = 0.0;
  fVar37 = 0.0;
  fVar31 = 0.0;
  if (pPVar15 == (Property *)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    lVar14 = __dynamic_cast(pPVar15,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar14 == 0) {
      fVar31 = 0.0;
      fVar36 = 0.0;
      fVar37 = 0.0;
    }
    else {
      fVar36 = (float)*(undefined8 *)(lVar14 + 8);
      fVar37 = (float)((ulong)*(undefined8 *)(lVar14 + 8) >> 0x20);
      fVar31 = *(float *)(lVar14 + 0x10);
      bVar13 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar24) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar13) && (1.1920929e-07 < fVar31 * fVar31 + fVar36 * fVar36 + fVar37 * fVar37)) {
    _Var25 = _Var25 | 0x2800;
    local_1b8 = 0x3f800000;
    local_1b4 = 0;
    local_1a4 = 0x3f800000;
    uStack_198 = 0;
    local_190 = 0x3f800000;
    uStack_184 = 0;
    local_17c = 0x3f800000;
    uStack_1ac = (ulong)(uint)fVar36;
    local_1a0 = (ulong)(uint)fVar37 << 0x20;
    local_18c = (ulong)(uint)fVar31;
    local_138 = 0x3f800000;
    local_134 = 0;
    local_124 = 0x3f800000;
    uStack_118 = 0;
    local_110 = 0x3f800000;
    uStack_104 = 0;
    local_fc = 0x3f800000;
    uStack_12c = (ulong)(uint)fVar36 ^ 0x80000000;
    local_120 = (ulong)(uint)fVar37 << 0x20 ^ 0x8000000000000000;
    local_10c = (ulong)(uint)fVar31 ^ 0x80000000;
  }
  local_5f0._0_8_ = pFVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"Lcl Translation","");
  pPVar15 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar36 = 0.0;
  fVar37 = 0.0;
  fVar31 = 0.0;
  if (pPVar15 == (Property *)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    lVar14 = __dynamic_cast(pPVar15,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar14 == 0) {
      fVar31 = 0.0;
      fVar36 = 0.0;
      fVar37 = 0.0;
    }
    else {
      fVar36 = (float)*(undefined8 *)(lVar14 + 8);
      fVar37 = (float)((ulong)*(undefined8 *)(lVar14 + 8) >> 0x20);
      fVar31 = *(float *)(lVar14 + 0x10);
      bVar13 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar24) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar13) && (1.1920929e-07 < fVar31 * fVar31 + fVar36 * fVar36 + fVar37 * fVar37)) {
    _Var25 = _Var25 | 8;
    local_3b8 = 0x3f800000;
    local_3b4 = 0;
    local_3a4 = 0x3f800000;
    uStack_398 = 0;
    local_390 = 0x3f800000;
    uStack_384 = 0;
    local_37c = 0x3f800000;
    uStack_3ac = (ulong)(uint)fVar36;
    local_3a0 = (ulong)(uint)fVar37 << 0x20;
    local_38c = (ulong)(uint)fVar31;
  }
  local_5f0._0_8_ = pFVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"Lcl Scaling","");
  pPVar15 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar36 = 0.0;
  fVar37 = 0.0;
  fVar31 = 0.0;
  if (pPVar15 == (Property *)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    lVar14 = __dynamic_cast(pPVar15,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar14 == 0) {
      fVar31 = 0.0;
      fVar36 = 0.0;
      fVar37 = 0.0;
    }
    else {
      fVar36 = (float)*(undefined8 *)(lVar14 + 8);
      fVar37 = (float)((ulong)*(undefined8 *)(lVar14 + 8) >> 0x20);
      fVar31 = *(float *)(lVar14 + 0x10);
      bVar13 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar24) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar13) &&
     (1.1920929e-07 <
      (fVar31 + -1.0) * (fVar31 + -1.0) +
      (fVar36 + -1.0) * (fVar36 + -1.0) + (fVar37 + -1.0) * (fVar37 + -1.0))) {
    _Var25 = _Var25 | 0x1000;
    local_174 = 0;
    uStack_16c = 0;
    local_160 = 0;
    uStack_158 = 0;
    local_14c = 0;
    uStack_144 = 0;
    local_13c = 0x3f800000;
    local_178 = fVar36;
    local_164 = fVar37;
    local_150 = fVar31;
  }
  local_5f0._0_8_ = pFVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"Lcl Rotation","");
  pPVar15 = PropertyTable::Get(this_00,(string *)local_5f0);
  local_640.x = 0.0;
  local_640.y = 0.0;
  fVar31 = 0.0;
  if (pPVar15 == (Property *)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    lVar14 = __dynamic_cast(pPVar15,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar14 == 0) {
      fVar31 = 0.0;
      local_640.x = 0.0;
      local_640.y = 0.0;
    }
    else {
      local_640.x = (float)*(undefined8 *)(lVar14 + 8);
      local_640.y = (float)((ulong)*(undefined8 *)(lVar14 + 8) >> 0x20);
      fVar31 = *(float *)(lVar14 + 0x10);
      bVar13 = true;
    }
  }
  pFVar23 = (FBXConverter *)local_5f0._0_8_;
  local_640.z = fVar31;
  if ((FBXConverter *)local_5f0._0_8_ != pFVar24) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar13) &&
     (1.1920929e-07 < fVar31 * fVar31 + local_640.x * local_640.x + local_640.y * local_640.y)) {
    _Var25 = _Var25 | 0x80;
    GetRotationMatrix(pFVar23,mode,&local_640,&local_2b8);
  }
  local_5f0._0_8_ = pFVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"GeometricScaling","");
  pPVar15 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar36 = 0.0;
  fVar37 = 0.0;
  fVar31 = 0.0;
  if (pPVar15 == (Property *)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    lVar14 = __dynamic_cast(pPVar15,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar14 == 0) {
      fVar36 = 0.0;
      fVar37 = 0.0;
      fVar31 = 0.0;
    }
    else {
      fVar36 = (float)*(undefined8 *)(lVar14 + 8);
      fVar37 = (float)((ulong)*(undefined8 *)(lVar14 + 8) >> 0x20);
      fVar31 = *(float *)(lVar14 + 0x10);
      bVar13 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar24) {
    operator_delete((void *)local_5f0._0_8_);
  }
  _Var26 = _Var25;
  if ((bVar13) &&
     (1.1920929e-07 <
      (fVar31 + -1.0) * (fVar31 + -1.0) +
      (fVar36 + -1.0) * (fVar36 + -1.0) + (fVar37 + -1.0) * (fVar37 + -1.0))) {
    _Var26 = _Var25 + 0x10000;
    local_74 = 0;
    uStack_6c = 0;
    local_60 = 0;
    uStack_58 = 0;
    local_4c = 0;
    uStack_44 = 0;
    local_3c = 0x3f800000;
    local_78 = fVar36;
    local_64 = fVar37;
    local_50 = fVar31;
    local_5f0._0_4_ = fVar36;
    local_610._0_4_ = fVar37;
    local_6a8._0_4_ = fVar31;
    iVar19 = 0;
    do {
      psVar21 = (string *)local_6a8;
      if ((iVar19 != 2) && (psVar21 = (string *)local_5f0, iVar19 == 1)) {
        psVar21 = (string *)local_610;
      }
      if (ABS(*(float *)&(psVar21->_M_dataplus)._M_p) <= 1.1920929e-07) {
        LogFunctions<Assimp::FBXImporter>::LogError((char *)0x172863);
        goto LAB_00172866;
      }
      fVar45 = fVar31;
      if ((iVar19 != 2) && (fVar45 = fVar36, iVar19 == 1)) {
        fVar45 = fVar37;
      }
      psVar21 = (string *)local_6a8;
      if ((iVar19 != 2) && (psVar21 = (string *)local_5f0, iVar19 == 1)) {
        psVar21 = (string *)local_610;
      }
      *(float *)&(psVar21->_M_dataplus)._M_p = 1.0 / fVar45;
      iVar19 = iVar19 + 1;
    } while (iVar19 != 3);
    _Var26 = _Var25 | 0x10001;
    local_478.a2 = 0.0;
    local_478.a3 = 0.0;
    local_478.a4 = 0.0;
    local_478.b1 = 0.0;
    local_478.b3 = 0.0;
    local_478.b4 = 0.0;
    local_478.c1 = 0.0;
    local_478.c2 = 0.0;
    local_478.c4 = 0.0;
    local_478.d1 = 0.0;
    local_478.d2 = 0.0;
    local_478.d3 = 0.0;
    local_478.d4 = 1.0;
    local_478.a1 = (float)local_5f0._0_4_;
    local_478.b2 = (float)local_610._0_4_;
    local_478.c3 = (float)local_6a8._0_4_;
  }
LAB_00172866:
  local_5f0._0_8_ = pFVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"GeometricRotation","");
  pPVar15 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar36 = 0.0;
  fVar37 = 0.0;
  fVar31 = 0.0;
  if (pPVar15 == (Property *)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    lVar14 = __dynamic_cast(pPVar15,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar14 == 0) {
      fVar31 = 0.0;
      fVar36 = 0.0;
      fVar37 = 0.0;
    }
    else {
      fVar36 = (float)*(undefined8 *)(lVar14 + 8);
      fVar37 = (float)((ulong)*(undefined8 *)(lVar14 + 8) >> 0x20);
      fVar31 = *(float *)(lVar14 + 0x10);
      bVar13 = true;
    }
  }
  pFVar23 = (FBXConverter *)local_5f0._0_8_;
  local_6a0 = fVar31;
  local_6a8._0_4_ = fVar36;
  local_6a8._4_4_ = fVar37;
  if ((FBXConverter *)local_5f0._0_8_ != pFVar24) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar13) &&
     (1.1920929e-07 <
      fVar31 * fVar31 +
      (float)local_6a8._0_4_ * (float)local_6a8._0_4_ +
      (float)local_6a8._4_4_ * (float)local_6a8._4_4_)) {
    _Var26 = _Var26 | 0x8002;
    GetRotationMatrix(pFVar23,mode,(aiVector3D *)local_6a8,&local_b8);
    GetRotationMatrix(pFVar23,mode,(aiVector3D *)local_6a8,&local_438);
    aiMatrix4x4t<float>::Inverse(&local_438);
  }
  local_5f0._0_8_ = (FBXConverter *)(local_5f0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"GeometricTranslation","");
  pPVar15 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar36 = 0.0;
  fVar37 = 0.0;
  fVar31 = 0.0;
  if (pPVar15 == (Property *)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    lVar14 = __dynamic_cast(pPVar15,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar14 == 0) {
      fVar31 = 0.0;
      fVar36 = 0.0;
      fVar37 = 0.0;
    }
    else {
      fVar36 = (float)*(undefined8 *)(lVar14 + 8);
      fVar37 = (float)((ulong)*(undefined8 *)(lVar14 + 8) >> 0x20);
      fVar31 = *(float *)(lVar14 + 0x10);
      bVar13 = true;
    }
  }
  pFVar24 = (FBXConverter *)local_5f0._0_8_;
  if ((FBXConverter *)local_5f0._0_8_ != (FBXConverter *)(local_5f0 + 0x10)) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar13) && (1.1920929e-07 < fVar31 * fVar31 + fVar36 * fVar36 + fVar37 * fVar37)) {
    _Var26 = _Var26 | 0x4004;
    local_f8 = 0x3f800000;
    local_f4 = 0;
    local_e4 = 0x3f800000;
    uStack_d8 = 0;
    local_d0 = 0x3f800000;
    uStack_c4 = 0;
    local_bc = 0x3f800000;
    uStack_ec = (ulong)(uint)fVar36;
    local_e0 = (ulong)(uint)fVar37 << 0x20;
    local_cc = (ulong)(uint)fVar31;
    local_3f8 = 0x3f800000;
    local_3f4 = 0;
    local_3e4 = 0x3f800000;
    uStack_3d8 = 0;
    local_3d0 = 0x3f800000;
    uStack_3c4 = 0;
    local_3bc = 0x3f800000;
    uStack_3ec = (ulong)(uint)fVar36 ^ 0x80000000;
    local_3e0 = (ulong)(uint)fVar37 << 0x20 ^ 0x8000000000000000;
    local_3cc = (ulong)(uint)fVar31 ^ 0x80000000;
  }
  bVar13 = NeedsComplexTransformationChain(pFVar24,model);
  if (bVar13 != ((_Var26 & 0x1ef77) != _S_red)) {
    __assert_fail("NeedsComplexTransformationChain(model) == ((chainBits & chainMaskComplex) != 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0x326,
                  "bool Assimp::FBX::FBXConverter::GenerateTransformationNodeChain(const Model &, const std::string &, std::vector<aiNode *> &, std::vector<aiNode *> &)"
                 );
  }
  if (((_Var26 & 0x1ef77) == _S_red) || (this->doc->settings->preservePivots != true)) {
    paVar18 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar18);
    local_5f0._0_8_ = paVar18;
    iVar22._M_current =
         (output_nodes->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar22._M_current ==
        (output_nodes->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                ((vector<aiNode*,std::allocator<aiNode*>> *)output_nodes,iVar22,(aiNode **)local_5f0
                );
    }
    else {
      *iVar22._M_current = paVar18;
      pppaVar1 = &(output_nodes->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppaVar1 = *pppaVar1 + 1;
    }
    uVar7 = local_5f0._0_8_;
    uVar27 = name->_M_string_length;
    if (uVar27 < 0x400) {
      *(int *)local_5f0._0_8_ = (int)uVar27;
      memcpy((char *)(local_5f0._0_8_ + 4),(name->_M_dataplus)._M_p,uVar27);
      *(char *)(uVar7 + uVar27 + 4) = '\0';
    }
    local_664 = ((aiMatrix4x4 *)(local_5f0._0_8_ + 0x404))->a1;
    fVar31 = *(float *)(local_5f0._0_8_ + 0x40c);
    fVar36 = *(float *)(local_5f0._0_8_ + 0x410);
    fVar37 = *(float *)(local_5f0._0_8_ + 0x414);
    fVar45 = *(float *)(local_5f0._0_8_ + 0x41c);
    local_728 = *(float *)(local_5f0._0_8_ + 0x420);
    fVar44 = *(float *)(local_5f0._0_8_ + 0x424);
    fVar30 = *(float *)(local_5f0._0_8_ + 0x42c);
    fVar28 = *(float *)(local_5f0._0_8_ + 0x430);
    fVar35 = *(float *)(local_5f0._0_8_ + 0x434);
    fVar41 = *(float *)(local_5f0._0_8_ + 0x43c);
    local_670 = *(float *)(local_5f0._0_8_ + 0x440);
    lVar14 = 0x3c;
    fVar32 = *(float *)(local_5f0._0_8_ + 0x408);
    local_6c4 = *(float *)(local_5f0._0_8_ + 0x438);
    local_6c0 = *(float *)(local_5f0._0_8_ + 0x428);
    local_6bc = *(float *)(local_5f0._0_8_ + 0x418);
    do {
      local_644 = *(float *)((long)afStack_4b4 + lVar14 + 0x10);
      fVar43 = *(float *)((long)afStack_4b4 + lVar14);
      fVar2 = *(float *)((long)afStack_4b4 + lVar14 + 0x20);
      local_65c = *(float *)((long)afStack_4b4 + lVar14 + 4);
      fVar42 = local_65c * local_664;
      local_660 = *(float *)((long)afStack_4b4 + lVar14 + 8);
      fVar38 = local_660 * local_664;
      local_668 = *(float *)((long)afStack_4b4 + lVar14 + 0xc);
      fVar34 = local_664 * local_668;
      fVar39 = local_65c * fVar37;
      local_648 = local_660 * fVar37;
      local_678 = fVar37 * local_668;
      local_64c = fVar43 * fVar44;
      local_650 = local_65c * fVar44;
      local_654 = local_660 * fVar44;
      local_680 = fVar44 * local_668;
      local_658 = fVar43 * fVar35;
      local_65c = local_65c * fVar35;
      local_660 = local_660 * fVar35;
      local_668 = local_668 * fVar35;
      fVar3 = *(float *)((long)afStack_4b4 + lVar14 + 0x30);
      local_664 = fVar3 * fVar36 + fVar2 * fVar31 + fVar43 * local_664 + fVar32 * local_644;
      local_698._12_4_ = *(float *)((long)afStack_4b4 + lVar14 + 0x14);
      fVar4 = *(float *)((long)afStack_4b4 + lVar14 + 0x24);
      local_698._M_allocated_capacity._4_4_ = *(float *)((long)afStack_4b4 + lVar14 + 0x34);
      local_66c = (float)local_698._M_allocated_capacity._4_4_ * fVar36 +
                  fVar4 * fVar31 + fVar42 + fVar32 * (float)local_698._12_4_;
      fVar42 = *(float *)((long)afStack_4b4 + lVar14 + 0x18);
      fVar5 = *(float *)((long)afStack_4b4 + lVar14 + 0x28);
      local_674 = *(float *)((long)afStack_4b4 + lVar14 + 0x2c);
      fVar40 = fVar31 * local_674;
      fVar29 = fVar45 * local_674;
      local_698._8_4_ = fVar4 * fVar30;
      local_688 = fVar5 * fVar30;
      fVar33 = fVar30 * local_674;
      local_684 = fVar4 * fVar41;
      local_67c = fVar5 * fVar41;
      local_674 = local_674 * fVar41;
      fVar6 = *(float *)((long)afStack_4b4 + lVar14 + 0x38);
      fVar31 = fVar6 * fVar36 + fVar5 * fVar31 + fVar38 + fVar32 * fVar42;
      local_698._M_allocated_capacity._0_4_ = *(float *)((long)afStack_4b4 + lVar14 + 0x1c);
      fVar38 = *(float *)((long)&local_478.a1 + lVar14);
      fVar36 = fVar36 * fVar38 +
               fVar40 + fVar34 + fVar32 * (float)local_698._M_allocated_capacity._0_4_;
      fVar37 = fVar3 * local_728 + fVar2 * fVar45 + fVar43 * fVar37 + local_6bc * local_644;
      fVar34 = (float)local_698._M_allocated_capacity._4_4_ * local_728 +
               fVar4 * fVar45 + fVar39 + local_6bc * (float)local_698._12_4_;
      fVar45 = fVar6 * local_728 + fVar5 * fVar45 + local_648 + local_6bc * fVar42;
      local_728 = local_728 * fVar38 +
                  fVar29 + local_678 + local_6bc * (float)local_698._M_allocated_capacity._0_4_;
      fVar44 = fVar3 * fVar28 + fVar2 * fVar30 + fVar43 * fVar44 + local_6c0 * local_644;
      fVar29 = (float)local_698._M_allocated_capacity._4_4_ * fVar28 +
               fVar4 * fVar30 + local_650 + local_6c0 * (float)local_698._12_4_;
      fVar30 = fVar6 * fVar28 + fVar5 * fVar30 + local_654 + local_6c0 * fVar42;
      fVar28 = fVar28 * fVar38 +
               fVar33 + local_680 + local_6c0 * (float)local_698._M_allocated_capacity._0_4_;
      fVar35 = fVar3 * local_670 + fVar2 * fVar41 + fVar43 * fVar35 + local_644 * local_6c4;
      fVar43 = (float)local_698._M_allocated_capacity._4_4_ * local_670 +
               fVar4 * fVar41 + local_65c + (float)local_698._12_4_ * local_6c4;
      fVar41 = fVar6 * local_670 + fVar5 * fVar41 + local_660 + fVar42 * local_6c4;
      local_670 = fVar38 * local_670 +
                  local_674 + local_668 + local_6c4 * (float)local_698._M_allocated_capacity._0_4_;
      ((aiMatrix4x4 *)(local_5f0._0_8_ + 0x404))->a1 = local_664;
      *(float *)(local_5f0._0_8_ + 0x408) = local_66c;
      *(float *)(local_5f0._0_8_ + 0x40c) = fVar31;
      *(float *)(local_5f0._0_8_ + 0x410) = fVar36;
      *(float *)(local_5f0._0_8_ + 0x414) = fVar37;
      *(float *)(local_5f0._0_8_ + 0x418) = fVar34;
      *(float *)(local_5f0._0_8_ + 0x41c) = fVar45;
      *(float *)(local_5f0._0_8_ + 0x420) = local_728;
      *(float *)(local_5f0._0_8_ + 0x424) = fVar44;
      *(float *)(local_5f0._0_8_ + 0x428) = fVar29;
      *(float *)(local_5f0._0_8_ + 0x42c) = fVar30;
      *(float *)(local_5f0._0_8_ + 0x430) = fVar28;
      *(float *)(local_5f0._0_8_ + 0x434) = fVar35;
      *(float *)(local_5f0._0_8_ + 0x438) = fVar43;
      *(float *)(local_5f0._0_8_ + 0x43c) = fVar41;
      *(float *)(local_5f0._0_8_ + 0x440) = local_670;
      lVar14 = lVar14 + 0x40;
      fVar32 = local_66c;
      local_6c4 = fVar43;
      local_6c0 = fVar29;
      local_6bc = fVar34;
    } while (lVar14 != 0x47c);
    bVar13 = false;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610,
                   "generating full transformation chain for node: ",name);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_5f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610);
    LogFunctions<Assimp::FBXImporter>::LogInfo((format *)local_5f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f0);
    std::ios_base::~ios_base(local_580);
    if ((aiNode *)local_610._0_8_ != (aiNode *)(local_610 + 0x10)) {
      operator_delete((void *)local_610._0_8_);
    }
    iVar22._M_current = (aiNode **)name;
    iVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find(&(this->node_anim_chain_bits)._M_t,name);
    if ((_Rb_tree_header *)iVar16._M_node ==
        &(this->node_anim_chain_bits)._M_t._M_impl.super__Rb_tree_header) {
      _Var25 = _S_red;
    }
    else {
      _Var25 = iVar16._M_node[2]._M_color;
    }
    _Var20 = _S_black;
    this_02 = &local_478;
    uVar27 = 0;
    do {
      if ((_Var20 & (_Var26 | _Var25)) != _S_red) {
        if (uVar27 == 8) {
          paVar17 = aiMatrix4x4t<float>::Inverse(this_02);
          fVar31 = paVar17->a2;
          fVar36 = paVar17->a3;
          fVar37 = paVar17->a4;
          fVar45 = paVar17->b1;
          fVar44 = paVar17->b2;
          fVar30 = paVar17->b3;
          fVar28 = paVar17->b4;
          fVar35 = paVar17->c1;
          fVar41 = paVar17->c2;
          fVar32 = paVar17->c3;
          fVar43 = paVar17->c4;
          fVar2 = paVar17->d1;
          fVar3 = paVar17->d2;
          fVar4 = paVar17->d3;
          fVar42 = paVar17->d4;
          this_02->a1 = paVar17->a1;
          this_02->a2 = fVar31;
          this_02->a3 = fVar36;
          this_02->a4 = fVar37;
          this_02->b1 = fVar45;
          this_02->b2 = fVar44;
          this_02->b3 = fVar30;
          this_02->b4 = fVar28;
          this_02->c1 = fVar35;
          this_02->c2 = fVar41;
          this_02->c3 = fVar32;
          this_02->c4 = fVar43;
          this_02->d1 = fVar2;
          this_02->d2 = fVar3;
          this_02->d3 = fVar4;
          this_02->d4 = fVar42;
        }
        paVar18 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar18);
        local_610._0_8_ = paVar18;
        NameTransformationChainNode
                  ((string *)local_5f0,(FBXConverter *)iVar22._M_current,name,
                   (TransformationComp)uVar27);
        uVar7 = local_5f0._8_8_;
        if ((ulong)local_5f0._8_8_ < 0x400) {
          (paVar18->mName).length = (ai_uint32)local_5f0._8_8_;
          memcpy((paVar18->mName).data,(void *)local_5f0._0_8_,local_5f0._8_8_);
          (paVar18->mName).data[uVar7] = '\0';
        }
        if ((FBXConverter *)local_5f0._0_8_ != (FBXConverter *)(local_5f0 + 0x10)) {
          operator_delete((void *)local_5f0._0_8_);
        }
        fVar31 = this_02->a1;
        fVar36 = this_02->a2;
        uVar7 = *(undefined8 *)&this_02->a3;
        uVar8 = *(undefined8 *)&this_02->b1;
        uVar9 = *(undefined8 *)&this_02->b3;
        uVar10 = *(undefined8 *)&this_02->c1;
        uVar11 = *(undefined8 *)&this_02->c3;
        uVar12 = *(undefined8 *)&this_02->d3;
        *(undefined8 *)(local_610._0_8_ + 0x434) = *(undefined8 *)&this_02->d1;
        *(undefined8 *)(local_610._0_8_ + 0x43c) = uVar12;
        *(undefined8 *)(local_610._0_8_ + 0x424) = uVar10;
        *(undefined8 *)(local_610._0_8_ + 0x42c) = uVar11;
        *(undefined8 *)(local_610._0_8_ + 0x414) = uVar8;
        *(undefined8 *)(local_610._0_8_ + 0x41c) = uVar9;
        ((aiMatrix4x4 *)(local_610._0_8_ + 0x404))->a1 = fVar31;
        ((aiMatrix4x4 *)(local_610._0_8_ + 0x404))->a2 = fVar36;
        *(undefined8 *)(local_610._0_8_ + 0x40c) = uVar7;
        this_01 = (vector<aiNode*,std::allocator<aiNode*>> *)post_output_nodes;
        if (2 < uVar27) {
          this_01 = (vector<aiNode*,std::allocator<aiNode*>> *)output_nodes;
        }
        iVar22._M_current = *(aiNode ***)(this_01 + 8);
        if (iVar22._M_current == *(aiNode ***)(this_01 + 0x10)) {
          std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                    (this_01,iVar22,(aiNode **)local_610);
        }
        else {
          *iVar22._M_current = (aiNode *)local_610._0_8_;
          *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
        }
      }
      uVar27 = uVar27 + 1;
      _Var20 = _Var20 * 2;
      this_02 = this_02 + 1;
    } while (uVar27 != 0x11);
    bVar13 = true;
    if ((output_nodes->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
        super__Vector_impl_data._M_finish ==
        (output_nodes->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      __assert_fail("output_nodes.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                    ,0x350,
                    "bool Assimp::FBX::FBXConverter::GenerateTransformationNodeChain(const Model &, const std::string &, std::vector<aiNode *> &, std::vector<aiNode *> &)"
                   );
    }
  }
  return bVar13;
}

Assistant:

bool FBXConverter::GenerateTransformationNodeChain(const Model& model, const std::string& name, std::vector<aiNode*>& output_nodes,
            std::vector<aiNode*>& post_output_nodes) {
            const PropertyTable& props = model.Props();
            const Model::RotOrder rot = model.RotationOrder();

            bool ok;

            aiMatrix4x4 chain[TransformationComp_MAXIMUM];

            ai_assert(TransformationComp_MAXIMUM < 32);
            std::uint32_t chainBits = 0;
            // A node won't need a node chain if it only has these.
            const std::uint32_t chainMaskSimple = (1 << TransformationComp_Translation) + (1 << TransformationComp_Scaling) + (1 << TransformationComp_Rotation);
            // A node will need a node chain if it has any of these.
            const std::uint32_t chainMaskComplex = ((1 << (TransformationComp_MAXIMUM)) - 1) - chainMaskSimple;

            std::fill_n(chain, static_cast<unsigned int>(TransformationComp_MAXIMUM), aiMatrix4x4());

            // generate transformation matrices for all the different transformation components
            const float zero_epsilon = Math::getEpsilon<float>();
            const aiVector3D all_ones(1.0f, 1.0f, 1.0f);

            const aiVector3D& PreRotation = PropertyGet<aiVector3D>(props, "PreRotation", ok);
            if (ok && PreRotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_PreRotation);

                GetRotationMatrix(Model::RotOrder::RotOrder_EulerXYZ, PreRotation, chain[TransformationComp_PreRotation]);
            }

            const aiVector3D& PostRotation = PropertyGet<aiVector3D>(props, "PostRotation", ok);
            if (ok && PostRotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_PostRotation);

                GetRotationMatrix(Model::RotOrder::RotOrder_EulerXYZ, PostRotation, chain[TransformationComp_PostRotation]);
            }

            const aiVector3D& RotationPivot = PropertyGet<aiVector3D>(props, "RotationPivot", ok);
            if (ok && RotationPivot.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_RotationPivot) | (1 << TransformationComp_RotationPivotInverse);

                aiMatrix4x4::Translation(RotationPivot, chain[TransformationComp_RotationPivot]);
                aiMatrix4x4::Translation(-RotationPivot, chain[TransformationComp_RotationPivotInverse]);
            }

            const aiVector3D& RotationOffset = PropertyGet<aiVector3D>(props, "RotationOffset", ok);
            if (ok && RotationOffset.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_RotationOffset);

                aiMatrix4x4::Translation(RotationOffset, chain[TransformationComp_RotationOffset]);
            }

            const aiVector3D& ScalingOffset = PropertyGet<aiVector3D>(props, "ScalingOffset", ok);
            if (ok && ScalingOffset.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_ScalingOffset);

                aiMatrix4x4::Translation(ScalingOffset, chain[TransformationComp_ScalingOffset]);
            }

            const aiVector3D& ScalingPivot = PropertyGet<aiVector3D>(props, "ScalingPivot", ok);
            if (ok && ScalingPivot.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_ScalingPivot) | (1 << TransformationComp_ScalingPivotInverse);

                aiMatrix4x4::Translation(ScalingPivot, chain[TransformationComp_ScalingPivot]);
                aiMatrix4x4::Translation(-ScalingPivot, chain[TransformationComp_ScalingPivotInverse]);
            }

            const aiVector3D& Translation = PropertyGet<aiVector3D>(props, "Lcl Translation", ok);
            if (ok && Translation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_Translation);

                aiMatrix4x4::Translation(Translation, chain[TransformationComp_Translation]);
            }

            const aiVector3D& Scaling = PropertyGet<aiVector3D>(props, "Lcl Scaling", ok);
            if (ok && (Scaling - all_ones).SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_Scaling);

                aiMatrix4x4::Scaling(Scaling, chain[TransformationComp_Scaling]);
            }

            const aiVector3D& Rotation = PropertyGet<aiVector3D>(props, "Lcl Rotation", ok);
            if (ok && Rotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_Rotation);

                GetRotationMatrix(rot, Rotation, chain[TransformationComp_Rotation]);
            }

            const aiVector3D& GeometricScaling = PropertyGet<aiVector3D>(props, "GeometricScaling", ok);
            if (ok && (GeometricScaling - all_ones).SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_GeometricScaling);
                aiMatrix4x4::Scaling(GeometricScaling, chain[TransformationComp_GeometricScaling]);
                aiVector3D GeometricScalingInverse = GeometricScaling;
                bool canscale = true;
                for (unsigned int i = 0; i < 3; ++i) {
                    if (std::fabs(GeometricScalingInverse[i]) > zero_epsilon) {
                        GeometricScalingInverse[i] = 1.0f / GeometricScaling[i];
                    }
                    else {
                        FBXImporter::LogError("cannot invert geometric scaling matrix with a 0.0 scale component");
                        canscale = false;
                        break;
                    }
                }
                if (canscale) {
                    chainBits = chainBits | (1 << TransformationComp_GeometricScalingInverse);
                    aiMatrix4x4::Scaling(GeometricScalingInverse, chain[TransformationComp_GeometricScalingInverse]);
                }
            }

            const aiVector3D& GeometricRotation = PropertyGet<aiVector3D>(props, "GeometricRotation", ok);
            if (ok && GeometricRotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_GeometricRotation) | (1 << TransformationComp_GeometricRotationInverse);
                GetRotationMatrix(rot, GeometricRotation, chain[TransformationComp_GeometricRotation]);
                GetRotationMatrix(rot, GeometricRotation, chain[TransformationComp_GeometricRotationInverse]);
                chain[TransformationComp_GeometricRotationInverse].Inverse();
            }

            const aiVector3D& GeometricTranslation = PropertyGet<aiVector3D>(props, "GeometricTranslation", ok);
            if (ok && GeometricTranslation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_GeometricTranslation) | (1 << TransformationComp_GeometricTranslationInverse);
                aiMatrix4x4::Translation(GeometricTranslation, chain[TransformationComp_GeometricTranslation]);
                aiMatrix4x4::Translation(-GeometricTranslation, chain[TransformationComp_GeometricTranslationInverse]);
            }

            // is_complex needs to be consistent with NeedsComplexTransformationChain()
            // or the interplay between this code and the animation converter would
            // not be guaranteed.
            ai_assert(NeedsComplexTransformationChain(model) == ((chainBits & chainMaskComplex) != 0));

            // now, if we have more than just Translation, Scaling and Rotation,
            // we need to generate a full node chain to accommodate for assimp's
            // lack to express pivots and offsets.
            if ((chainBits & chainMaskComplex) && doc.Settings().preservePivots) {
                FBXImporter::LogInfo("generating full transformation chain for node: " + name);

                // query the anim_chain_bits dictionary to find out which chain elements
                // have associated node animation channels. These can not be dropped
                // even if they have identity transform in bind pose.
                NodeAnimBitMap::const_iterator it = node_anim_chain_bits.find(name);
                const unsigned int anim_chain_bitmask = (it == node_anim_chain_bits.end() ? 0 : (*it).second);

                unsigned int bit = 0x1;
                for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i, bit <<= 1) {
                    const TransformationComp comp = static_cast<TransformationComp>(i);

                    if ((chainBits & bit) == 0 && (anim_chain_bitmask & bit) == 0) {
                        continue;
                    }

                    if (comp == TransformationComp_PostRotation) {
                        chain[i] = chain[i].Inverse();
                    }

                    aiNode* nd = new aiNode();
                    nd->mName.Set(NameTransformationChainNode(name, comp));
                    nd->mTransformation = chain[i];

                    // geometric inverses go in a post-node chain
                    if (comp == TransformationComp_GeometricScalingInverse ||
                        comp == TransformationComp_GeometricRotationInverse ||
                        comp == TransformationComp_GeometricTranslationInverse
                        ) {
                        post_output_nodes.push_back(nd);
                    }
                    else {
                        output_nodes.push_back(nd);
                    }
                }

                ai_assert(output_nodes.size());
                return true;
            }

            // else, we can just multiply the matrices together
            aiNode* nd = new aiNode();
            output_nodes.push_back(nd);

            // name passed to the method is already unique
            nd->mName.Set(name);

            for (const auto &transform : chain) {
                nd->mTransformation = nd->mTransformation * transform;
            }
            return false;
        }